

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_1::UnspecifiedAttachmentSizeCase::test
          (UnspecifiedAttachmentSizeCase *this)

{
  CallLogWrapper *this_00;
  uint in_EAX;
  ulong uStack_28;
  GLuint framebufferID;
  
  uStack_28 = (ulong)in_EAX;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&framebufferID);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[7])(this);
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		// check color target
		testColorAttachment();

		// check depth target
		testDepthAttachment();

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}